

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O2

int luaB_tonumber(lua_State *L)

{
  ushort uVar1;
  ushort *puVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  ushort **ppuVar8;
  byte *pbVar9;
  __int32_t **pp_Var10;
  size_t sVar11;
  undefined8 in_RCX;
  ulong uVar12;
  byte *__s;
  long lVar13;
  lua_Integer local_58;
  size_t l;
  char *local_48;
  lua_State *local_40;
  undefined8 local_38;
  
  iVar3 = lua_type(L,2);
  if (iVar3 < 1) {
    iVar3 = lua_type(L,1);
    if (iVar3 == 3) {
      lua_settop(L,1);
      return 1;
    }
    pcVar6 = lua_tolstring(L,1,&l);
    if ((pcVar6 != (char *)0x0) && (sVar11 = lua_stringtonumber(L,pcVar6), sVar11 == l + 1)) {
      return 1;
    }
    luaL_checkany(L,1);
  }
  else {
    uVar5 = luaL_checkinteger(L,2);
    luaL_checktype(L,1,4);
    pcVar6 = lua_tolstring(L,1,&l);
    if (0x22 < uVar5 - 2) {
      luaL_argerror(L,2,"base out of range");
    }
    sVar7 = strspn(pcVar6," \f\n\r\t\v");
    local_38 = CONCAT71((int7)((ulong)in_RCX >> 8),pcVar6[sVar7]);
    __s = (byte *)(pcVar6 + ((pcVar6[sVar7] - 0x2bU & 0xfd) == 0) + sVar7);
    ppuVar8 = __ctype_b_loc();
    puVar2 = *ppuVar8;
    uVar12 = (ulong)*__s;
    uVar1 = puVar2[uVar12];
    local_58 = 0;
    pbVar9 = (byte *)0x0;
    if ((uVar1 & 8) != 0) {
      local_58 = 0;
      lVar13 = 0;
      local_48 = pcVar6;
      local_40 = L;
      do {
        if ((uVar1 >> 0xb & 1) == 0) {
          pp_Var10 = __ctype_toupper_loc();
          uVar4 = (*pp_Var10)[uVar12] - 0x37;
        }
        else {
          uVar4 = (int)(char)uVar12 - 0x30;
        }
        if ((uint)uVar5 <= uVar4) {
          pbVar9 = (byte *)0x0;
          pcVar6 = local_48;
          L = local_40;
          goto LAB_00120d4e;
        }
        lVar13 = lVar13 * (uVar5 & 0xffffffff) + (ulong)uVar4;
        uVar12 = (ulong)__s[1];
        __s = __s + 1;
        uVar1 = puVar2[uVar12];
      } while ((uVar1 & 8) != 0);
      sVar7 = strspn((char *)__s," \f\n\r\t\v");
      pbVar9 = __s + sVar7;
      pcVar6 = local_48;
      L = local_40;
      local_58 = -lVar13;
      if ((char)local_38 != '-') {
        local_58 = lVar13;
      }
    }
LAB_00120d4e:
    if (pbVar9 == (byte *)(pcVar6 + l)) {
      lua_pushinteger(L,local_58);
      return 1;
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int luaB_tonumber (lua_State *L) {
  if (lua_isnoneornil(L, 2)) {  /* standard conversion? */
    if (lua_type(L, 1) == LUA_TNUMBER) {  /* already a number? */
      lua_settop(L, 1);  /* yes; return it */
      return 1;
    }
    else {
      size_t l;
      const char *s = lua_tolstring(L, 1, &l);
      if (s != NULL && lua_stringtonumber(L, s) == l + 1)
        return 1;  /* successful conversion to number */
      /* else not a number */
      luaL_checkany(L, 1);  /* (but there must be some parameter) */
    }
  }
  else {
    size_t l;
    const char *s;
    lua_Integer n = 0;  /* to avoid warnings */
    lua_Integer base = luaL_checkinteger(L, 2);
    luaL_checktype(L, 1, LUA_TSTRING);  /* no numbers as strings */
    s = lua_tolstring(L, 1, &l);
    luaL_argcheck(L, 2 <= base && base <= 36, 2, "base out of range");
    if (b_str2int(s, cast_uint(base), &n) == s + l) {
      lua_pushinteger(L, n);
      return 1;
    }  /* else not a number */
  }  /* else not a number */
  luaL_pushfail(L);  /* not a number */
  return 1;
}